

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.h
# Opt level: O2

void __thiscall CLI::Range::Range<unsigned_int>(Range *this,uint min,uint max)

{
  ostream *poVar1;
  stringstream out;
  string sStack_1c8;
  anon_class_8_2_43e49337 local_1a8;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  Validator::Validator(&this->super_Validator);
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"UINT");
  poVar1 = std::operator<<(poVar1," in [");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," - ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"]");
  std::__cxx11::stringbuf::str();
  Validator::description(&this->super_Validator,&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  local_1a8.min = min;
  local_1a8.max = max;
  std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,&local_1a8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

Range(T min, T max) {
        std::stringstream out;
        out << detail::type_name<T>() << " in [" << min << " - " << max << "]";
        description(out.str());

        func_ = [min, max](std::string &input) {
            T val;
            bool converted = detail::lexical_cast(input, val);
            if((!converted) || (val < min || val > max))
                return std::string("Value ") + input + " not in range " + std::to_string(min) + " to " +
                       std::to_string(max);

            return std::string();
        };
    }